

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O1

void __thiscall cmCTestHG::LogParser::~LogParser(LogParser *this)

{
  pointer pcVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  (this->super_OutputLogger).super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LogParser_006bb068;
  (this->super_cmXMLParser)._vptr_cmXMLParser = (_func_int **)&PTR__LogParser_006bb0b8;
  cmXMLParser::CleanupParser(&this->super_cmXMLParser);
  pcVar1 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar1 != (pointer)0x0) {
    operator_delete(pcVar1,(long)(this->CData).super__Vector_base<char,_std::allocator<char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pcVar1);
  }
  pcVar2 = (this->CurChange).Path._M_dataplus._M_p;
  paVar3 = &(this->CurChange).Path.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::~vector
            (&this->Changes);
  cmCTestVC::Revision::~Revision(&this->Rev);
  cmXMLParser::~cmXMLParser(&this->super_cmXMLParser);
  (this->super_OutputLogger).super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_006bc790;
  pcVar2 = (this->super_OutputLogger).super_LineParser.Line._M_dataplus._M_p;
  paVar3 = &(this->super_OutputLogger).super_LineParser.Line.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~LogParser() { this->CleanupParser(); }